

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Modules.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* SoapySDR::listSearchPaths_abi_cxx11_(void)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  istream *piVar4;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *in_RDI;
  string pluginPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  stringstream pluginPaths;
  
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  getRootPath_abi_cxx11_();
  std::operator+(&pluginPath,&local_1c8,"/lib/SoapySDR/modules");
  getABIVersion_abi_cxx11_();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pluginPaths,
                 &pluginPath,&local_1e8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &pluginPaths);
  std::__cxx11::string::~string((string *)&pluginPaths);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&pluginPath);
  std::__cxx11::string::~string((string *)&local_1c8);
  getRootPath_abi_cxx11_();
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &pluginPaths,"/usr");
  std::__cxx11::string::~string((string *)&pluginPaths);
  if (bVar1) {
    getABIVersion_abi_cxx11_();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pluginPaths
                   ,"/usr/local/lib/SoapySDR/modules",&pluginPath);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &pluginPaths);
    std::__cxx11::string::~string((string *)&pluginPaths);
    std::__cxx11::string::~string((string *)&pluginPath);
    if (listSearchPaths[abi:cxx11]()::libsuffix_abi_cxx11_ == '\0') {
      iVar2 = __cxa_guard_acquire(&listSearchPaths[abi:cxx11]()::libsuffix_abi_cxx11_);
      if (iVar2 != 0) {
        std::__cxx11::string::string
                  ((string *)&listSearchPaths[abi:cxx11]()::libsuffix_abi_cxx11_,"",
                   (allocator *)&pluginPaths);
        __cxa_atexit(std::__cxx11::string::~string,
                     &listSearchPaths[abi:cxx11]()::libsuffix_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&listSearchPaths[abi:cxx11]()::libsuffix_abi_cxx11_);
      }
    }
    if (listSearchPaths[abi:cxx11]()::libsuffix_abi_cxx11_._M_string_length != 0) {
      pcVar3 = (char *)std::__cxx11::string::at(0x143220);
      if (*pcVar3 == '/') {
        getABIVersion_abi_cxx11_();
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pluginPaths,"/usr/local/lib/SoapySDR/modules",&pluginPath);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &pluginPaths);
        std::__cxx11::string::~string((string *)&pluginPaths);
        std::__cxx11::string::~string((string *)&pluginPath);
      }
    }
  }
  getEnvImpl_abi_cxx11_(&pluginPath,"SOAPY_SDR_PLUGIN_PATH");
  std::__cxx11::stringstream::stringstream
            ((stringstream *)&pluginPaths,(string *)&pluginPath,_S_out|_S_in);
  std::__cxx11::string::~string((string *)&pluginPath);
  pluginPath._M_dataplus._M_p = (pointer)&pluginPath.field_2;
  pluginPath._M_string_length = 0;
  pluginPath.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&pluginPaths,(string *)&pluginPath,':');
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
    if (pluginPath._M_string_length != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_RDI,&pluginPath);
    }
  }
  std::__cxx11::string::~string((string *)&pluginPath);
  std::__cxx11::stringstream::~stringstream((stringstream *)&pluginPaths);
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_RDI;
}

Assistant:

std::vector<std::string> SoapySDR::listSearchPaths(void)
{
    //the default search path
    std::vector<std::string> searchPaths;
    searchPaths.push_back(SoapySDR::getRootPath() + "/lib/SoapySDR/modules" + SoapySDR::getABIVersion());

    //support /usr/local module installs when the install prefix is /usr
    if (SoapySDR::getRootPath() == "/usr")
    {
        searchPaths.push_back("/usr/local/lib/SoapySDR/modules" + SoapySDR::getABIVersion());
        //when using a multi-arch directory, support single-arch path as well
        static const std::string libsuffix("");
        if (not libsuffix.empty() and libsuffix.at(0) == '/')
            searchPaths.push_back("/usr/local/lib/SoapySDR/modules" + SoapySDR::getABIVersion());
    }

    //separator for search paths
    #ifdef _MSC_VER
    static const char sep = ';';
    #else
    static const char sep = ':';
    #endif

    //check the environment's search path
    std::stringstream pluginPaths(getEnvImpl("SOAPY_SDR_PLUGIN_PATH"));
    std::string pluginPath;
    while (std::getline(pluginPaths, pluginPath, sep))
    {
        if (pluginPath.empty()) continue;
        searchPaths.push_back(pluginPath);
    }

    return searchPaths;
}